

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.cpp
# Opt level: O2

bool duckdb::VectorStringToArray::StringToNestedTypeCastLoop
               (string_t *source_data,ValidityMask *source_mask,Vector *result,
               ValidityMask *result_mask,idx_t count,CastParameters *parameters,SelectionVector *sel
               )

{
  bool bVar1;
  CastParameters *pCVar2;
  bool bVar3;
  byte bVar4;
  idx_t iVar5;
  Vector *pVVar6;
  BoundCastData *pBVar7;
  ConversionException *this;
  undefined1 uVar8;
  idx_t iVar9;
  idx_t iVar10;
  string_t *psVar11;
  idx_t iVar12;
  allocator local_211;
  idx_t local_210;
  TemplatedValidityMask<unsigned_long> *local_208;
  CastParameters *local_200;
  idx_t local_1f8;
  Vector *local_1f0;
  LogicalType *local_1e8;
  string_t *local_1e0;
  TemplatedValidityMask<unsigned_long> *local_1d8;
  idx_t total;
  idx_t local_1c8;
  string_t *local_1c0;
  string local_1b8;
  VectorTryCastData vector_cast_data;
  LogicalType local_180;
  string local_168;
  string error;
  string local_118;
  string local_f8 [32];
  Vector varchar_vector;
  string local_70;
  string local_50 [32];
  
  local_1e8 = &result->type;
  local_208 = &result_mask->super_TemplatedValidityMask<unsigned_long>;
  local_200 = parameters;
  local_1f8 = count;
  local_1f0 = result;
  local_1e0 = source_data;
  local_1d8 = &source_mask->super_TemplatedValidityMask<unsigned_long>;
  local_210 = ArrayType::GetSize(local_1e8);
  bVar1 = true;
  iVar9 = 0;
  do {
    if (local_1f8 == iVar9) {
      iVar9 = local_210 * local_1f8;
      LogicalType::LogicalType(&local_180,VARCHAR);
      local_1c8 = iVar9;
      Vector::Vector(&varchar_vector,&local_180,iVar9);
      LogicalType::~LogicalType(&local_180);
      local_1c0 = (string_t *)varchar_vector.data;
      vector_cast_data.result = local_1f0;
      vector_cast_data.parameters = local_200;
      vector_cast_data.all_converted = true;
      total = 0;
      iVar5 = 0;
      for (iVar9 = 0; iVar9 != local_1f8; iVar9 = iVar9 + 1) {
        iVar10 = iVar9;
        if ((sel != (SelectionVector *)0x0) && (sel->sel_vector != (sel_t *)0x0)) {
          iVar10 = (idx_t)sel->sel_vector[iVar9];
        }
        bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_1d8,iVar10);
        if ((bVar3) &&
           (bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_208,iVar9), bVar3)) {
          psVar11 = local_1e0 + iVar10;
          bVar3 = VectorStringToList::SplitStringList(psVar11,local_1c0,&total,&varchar_vector);
          if (!bVar3) {
            ::std::__cxx11::string::string
                      (local_f8,
                       "Type VARCHAR with value \'%s\' can\'t be cast to the destination type %s",
                       &local_211);
            string_t::GetString_abi_cxx11_(&local_118,psVar11);
            LogicalType::ToString_abi_cxx11_(&local_1b8,local_1e8);
            StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                      (&error,(StringUtil *)local_f8,&local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)count);
            ::std::__cxx11::string::~string((string *)&local_1b8);
            ::std::__cxx11::string::~string((string *)&local_118);
            ::std::__cxx11::string::~string(local_f8);
            HandleVectorCastError::Operation<duckdb::string_t>
                      (&error,(ValidityMask *)local_208,iVar9,&vector_cast_data);
            ::std::__cxx11::string::~string((string *)&error);
          }
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid(local_208,iVar9);
          iVar10 = iVar5;
          iVar12 = local_210;
          while (bVar3 = iVar12 != 0, iVar12 = iVar12 - 1, bVar3) {
            FlatVector::SetNull(&varchar_vector,iVar10,true);
            iVar10 = iVar10 + 1;
          }
          total = total + local_210;
        }
        iVar5 = iVar5 + local_210;
      }
      pVVar6 = ArrayVector::GetEntry(local_1f0);
      pCVar2 = local_200;
      pBVar7 = optional_ptr<duckdb::BoundCastData,_true>::operator->(&local_200->cast_data);
      error._M_dataplus._M_p = (pointer)pBVar7[3]._vptr_BoundCastData;
      error._M_string_length._0_1_ = pCVar2->strict;
      error.field_2._M_allocated_capacity._0_4_ = *(undefined4 *)&pCVar2->error_message;
      error.field_2._M_allocated_capacity._4_4_ = *(undefined4 *)((long)&pCVar2->error_message + 4);
      error.field_2._8_4_ = *(undefined4 *)&(pCVar2->local_state).ptr;
      error.field_2._12_4_ = *(undefined4 *)((long)&(pCVar2->local_state).ptr + 4);
      bVar4 = (*(code *)pBVar7[1]._vptr_BoundCastData)(&varchar_vector,pVVar6,local_1c8);
      uVar8 = vector_cast_data.all_converted;
      if ((bVar4 & bVar1) != 1) {
        uVar8 = 0;
      }
      Vector::~Vector(&varchar_vector);
      return (bool)uVar8;
    }
    iVar5 = iVar9;
    if ((sel != (SelectionVector *)0x0) && (sel->sel_vector != (sel_t *)0x0)) {
      iVar5 = (idx_t)sel->sel_vector[iVar9];
    }
    bVar3 = TemplatedValidityMask<unsigned_long>::RowIsValid(local_1d8,iVar5);
    if (bVar3) {
      psVar11 = local_1e0 + iVar5;
      iVar5 = VectorStringToList::CountPartsList(psVar11);
      if (local_210 != iVar5) {
        if (bVar1) {
          ::std::__cxx11::string::string
                    (local_50,
                     "Type VARCHAR with value \'%s\' can\'t be cast to the destination type %s, the size of the array must match the destination type"
                     ,(allocator *)&error);
          string_t::GetString_abi_cxx11_(&local_168,psVar11);
          LogicalType::ToString_abi_cxx11_(&local_70,local_1e8);
          StringUtil::Format<std::__cxx11::string,std::__cxx11::string>
                    ((string *)&varchar_vector,(StringUtil *)local_50,&local_168,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)count);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_168);
          ::std::__cxx11::string::~string(local_50);
          if (local_200->strict == true) {
            this = (ConversionException *)__cxa_allocate_exception(0x10);
            ConversionException::ConversionException(this,(string *)&varchar_vector);
            __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
          }
          HandleCastError::AssignError((string *)&varchar_vector,local_200);
          ::std::__cxx11::string::~string((string *)&varchar_vector);
          bVar1 = false;
        }
        TemplatedValidityMask<unsigned_long>::SetInvalid(local_208,iVar9);
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

bool VectorStringToArray::StringToNestedTypeCastLoop(const string_t *source_data, ValidityMask &source_mask,
                                                     Vector &result, ValidityMask &result_mask, idx_t count,
                                                     CastParameters &parameters, const SelectionVector *sel) {
	idx_t array_size = ArrayType::GetSize(result.GetType());
	bool all_lengths_match = true;

	for (idx_t i = 0; i < count; i++) {
		idx_t idx = i;
		if (sel) {
			idx = sel->get_index(i);
		}
		if (!source_mask.RowIsValid(idx)) {
			continue;
		}
		auto str_array_size = VectorStringToList::CountPartsList(source_data[idx]);
		if (array_size != str_array_size) {
			if (all_lengths_match) {
				all_lengths_match = false;
				auto msg = StringUtil::Format("Type VARCHAR with value '%s' can't be cast to the destination type %s"
				                              ", the size of the array must match the destination type",
				                              source_data[idx].GetString(), result.GetType().ToString());
				if (parameters.strict) {
					throw ConversionException(msg);
				}
				HandleCastError::AssignError(msg, parameters);
			}
			result_mask.SetInvalid(i);
		}
	}

	auto child_count = array_size * count;
	Vector varchar_vector(LogicalType::VARCHAR, child_count);
	auto child_data = FlatVector::GetData<string_t>(varchar_vector);

	VectorTryCastData vector_cast_data(result, parameters);
	idx_t total = 0;
	for (idx_t i = 0; i < count; i++) {
		idx_t idx = i;
		if (sel) {
			idx = sel->get_index(i);
		}

		if (!source_mask.RowIsValid(idx) || !result_mask.RowIsValid(i)) {
			// The source is null, or there was a size-mismatch above, so dont try to split the string
			result_mask.SetInvalid(i);

			// Null the entire array
			for (idx_t j = 0; j < array_size; j++) {
				FlatVector::SetNull(varchar_vector, i * array_size + j, true);
			}

			total += array_size;
			continue;
		}

		if (!VectorStringToList::SplitStringList(source_data[idx], child_data, total, varchar_vector)) {
			auto error = StringUtil::Format("Type VARCHAR with value '%s' can't be cast to the destination type %s",
			                                source_data[idx].GetString(), result.GetType().ToString());
			HandleVectorCastError::Operation<string_t>(error, result_mask, i, vector_cast_data);
		}
	}
	D_ASSERT(total == child_count);

	auto &result_child = ArrayVector::GetEntry(result);
	auto &cast_data = parameters.cast_data->Cast<ArrayBoundCastData>();
	CastParameters child_parameters(parameters, cast_data.child_cast_info.cast_data, parameters.local_state);
	bool cast_result = cast_data.child_cast_info.function(varchar_vector, result_child, child_count, child_parameters);

	return all_lengths_match && cast_result && vector_cast_data.all_converted;
}